

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O0

quad_lookup_t * quad_lookup_create(uint rate,uint order,uint *table)

{
  uint uVar1;
  distance_quad_key_t *pdVar2;
  output_quad_t *poVar3;
  void *__ptr;
  distance_quad_t *pdVar4;
  byte bVar5;
  long in_RCX;
  char in_DL;
  uint in_ESI;
  quad_lookup_t *in_RDI;
  quad_lookup_t *quads;
  uint out;
  uint i;
  uint output_counter;
  uint *inv_outputs;
  uint local_20;
  uint local_1c;
  
  pdVar2 = (distance_quad_key_t *)malloc((long)(1 << (in_DL - 2U & 0x1f)) << 2);
  in_RDI->keys = pdVar2;
  poVar3 = (output_quad_t *)calloc((long)(1 << ((byte)(in_ESI << 2) & 0x1f)),4);
  in_RDI->outputs = poVar3;
  __ptr = calloc((long)(1 << ((byte)(in_ESI << 2) & 0x1f)),4);
  local_1c = 1;
  for (local_20 = 0; bVar5 = (byte)in_ESI, local_20 < (uint)(1 << (in_DL - 2U & 0x1f));
      local_20 = local_20 + 1) {
    uVar1 = *(uint *)(in_RCX + (ulong)(local_20 << 2) * 4) |
            (*(uint *)(in_RCX + (ulong)(local_20 * 4 + 1) * 4) |
            (*(uint *)(in_RCX + (ulong)(local_20 * 4 + 2) * 4) |
            *(int *)(in_RCX + (ulong)(local_20 * 4 + 3) * 4) << (bVar5 & 0x1f)) << (bVar5 & 0x1f))
            << (bVar5 & 0x1f);
    if (*(int *)((long)__ptr + (ulong)uVar1 * 4) == 0) {
      *(uint *)((long)__ptr + (ulong)uVar1 * 4) = local_1c;
      in_RDI->outputs[local_1c] = uVar1;
      local_1c = local_1c + 1;
    }
    in_RDI->keys[local_20] = *(distance_quad_key_t *)((long)__ptr + (ulong)uVar1 * 4);
  }
  in_RDI->outputs_len = (ulong)local_1c;
  in_RDI->output_mask = (1 << (bVar5 & 0x1f)) - 1;
  in_RDI->output_width = in_ESI;
  pdVar4 = (distance_quad_t *)calloc(in_RDI->outputs_len,8);
  in_RDI->distances = pdVar4;
  free(__ptr);
  return in_RDI;
}

Assistant:

quad_lookup_t quad_lookup_create(unsigned int rate,
                                 unsigned int order,
                                 const unsigned int *table) {
    quad_lookup_t quads;

    quads.keys = malloc(sizeof(unsigned int) * (1 << (order - 2)));
    quads.outputs = calloc((1 << (rate * 4)), sizeof(unsigned int));
    unsigned int *inv_outputs = calloc((1 << (rate * 4)), sizeof(unsigned int));
    unsigned int output_counter = 1;
    // for every (even-numbered) shift register state, find the concatenated output of the state
    //   and the subsequent state that follows it (low bit set). then, check to see if this
    //   concatenated output has a unique key assigned to it already. if not, give it a key.
    //   if it does, retrieve the key. assign this key to the shift register state.
    for (unsigned int i = 0; i < (1 << (order - 2)); i++) {
        // first get the concatenated quad of outputs
        unsigned int out = table[i * 4 + 3];
        out <<= rate;
        out |= table[i * 4 + 2];
        out <<= rate;
        out |= table[i * 4 + 1];
        out <<= rate;
        out |= table[i * 4];

        // does this concatenated output exist in the outputs table yet?
        if (!inv_outputs[out]) {
            // doesn't exist, allocate a new key
            inv_outputs[out] = output_counter;
            quads.outputs[output_counter] = out;
            output_counter++;
        }
        // set the opaque key for the ith shift register state to the concatenated output entry
        quads.keys[i] = inv_outputs[out];
    }
    quads.outputs_len = output_counter;
    quads.output_mask = (1 << (rate)) - 1;
    quads.output_width = rate;
    quads.distances = calloc(quads.outputs_len, sizeof(distance_quad_t));
    free(inv_outputs);
    return quads;
}